

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

int String::compare(char *s1,char *s2,usize len)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)(s1 + len);
  while( true ) {
    if (pbVar2 <= s1) {
      return 0;
    }
    bVar1 = *s1;
    if ((bVar1 == 0) || (bVar1 != *s2)) break;
    s1 = (char *)((byte *)s1 + 1);
    s2 = (char *)((byte *)s2 + 1);
  }
  return (uint)bVar1 - (uint)(byte)*s2;
}

Assistant:

static int compare(const char* s1, const char* s2, usize len)
  {
    for(const char* end1 = s1 + len; s1 < end1; ++s1, ++s2)
      if(!*s1 || *s1 != *s2)
        return (int)*(const uchar*)s1 - *(const uchar*)s2;
    return 0;
  }